

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectChildIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,sqlid_t parent)

{
  allocator local_111;
  string local_110 [32];
  Transformer local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  string local_58 [32];
  shared_res<hiberlite::autoclosed_con> local_38;
  sqlid_t local_28;
  sqlid_t parent_local;
  string *table_local;
  shared_connection *con_local;
  
  local_28 = parent;
  parent_local = (sqlid_t)table;
  table_local = (string *)con;
  con_local = (shared_connection *)__return_storage_ptr__;
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_38,con);
  std::__cxx11::string::string(local_58,(string *)table);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"hiberlite_parent_id",&local_c9);
  std::operator+(local_a8,(char *)local_c8);
  Transformer::toSQLiteValue_abi_cxx11_(local_f0,&local_28);
  std::operator+(local_88,local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"hiberlite_entry_indx",&local_111);
  dbSelectIds(__return_storage_ptr__,&local_38,(string *)local_58,local_88,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_58);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectChildIds(shared_connection con, std::string table, sqlid_t parent)
{
	return dbSelectIds(con, table, std::string(HIBERLITE_PARENTID_COLUMN)+"="+Transformer::toSQLiteValue(parent)
									, HIBERLITE_ENTRY_INDEX_COLUMN);
}